

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# examples.h
# Opt level: O0

void examples(void)

{
  liblogger::LogManager::PrintAll();
  liblogger::LogDebug("Debug Logging #1");
  liblogger::LogDebug("Debug Logging #%d",2);
  liblogger::LogInfo("Info Logging #1");
  liblogger::LogInfo("Info Logging #%d",2);
  liblogger::LogNotice("Notice Logging #1");
  liblogger::LogNotice("%s Logging #2","Notice");
  liblogger::LogWarning("Warning!!!!!!");
  liblogger::LogWarning("Warning!!!!!! #%d",2);
  liblogger::LogError("This is an Error");
  liblogger::LogError("This is an Error %d",2);
  liblogger::LogError("Something Critical happened");
  liblogger::LogError("Something Critical happened %s","Really BAD!");
  liblogger::LogAlert("Alert Alert");
  liblogger::LogAlert("Alert Alert %s","Alert");
  liblogger::LogCritical("TestLog Critical!");
  liblogger::LogEmergency("TestLog Emergency!");
  return;
}

Assistant:

static void examples()
{
	LogManager::PrintAll();

	LogDebug("Debug Logging #1");
	LogDebug("Debug Logging #%d", 2);

	LogInfo("Info Logging #1");
	LogInfo("Info Logging #%d", 2);

	LogNotice("Notice Logging #1");
	LogNotice("%s Logging #2", "Notice");

	LogWarning("Warning!!!!!!");
	LogWarning("Warning!!!!!! #%d", 2);

	LogError("This is an Error");
	LogError("This is an Error %d", 2);

	LogError("Something Critical happened");
	LogError("Something Critical happened %s", "Really BAD!");

	LogAlert("Alert Alert");
	LogAlert("Alert Alert %s", "Alert");

	LogCritical("TestLog Critical!");
	
	LogEmergency("TestLog Emergency!");

}